

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

bool anon_unknown.dwarf_41b5d::SetVoiceOffset
               (Voice *oldvoice,VoicePos *vpos,ALsource *source,ALCcontext *context,
               ALCdevice *device)

{
  Voice *pVVar1;
  bool bVar2;
  State SVar3;
  iterator ppVVar4;
  __pointer_type this;
  index_type iVar5;
  index_type iVar6;
  iterator ppVVar7;
  VoiceChange *pVVar8;
  long in_RCX;
  long in_RDX;
  __int_type *in_RSI;
  Voice *in_RDI;
  VoiceChange *vchg;
  Voice *voice_1;
  iterator __end2;
  iterator __begin2;
  span<Voice_*,_18446744073709551615UL> *__range2;
  FlexArray<Voice_*,_8UL> *allvoices;
  Voice *voice;
  iterator __end1;
  iterator __begin1;
  span<Voice_*,_18446744073709551615UL> *__range1;
  ALuint vidx;
  Voice *newvoice;
  span<Voice_*,_18446744073709551615UL> voicelist;
  memory_order __b_4;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_5;
  memory_order __b_3;
  memory_order __b_2;
  ALCdevice *in_stack_00001608;
  ALCcontext *in_stack_00001610;
  BufferlistItem *in_stack_00001618;
  ALsource *in_stack_00001620;
  Voice *in_stack_00001628;
  memory_order in_stack_fffffffffffffe20;
  memory_order in_stack_fffffffffffffe24;
  memory_order __m;
  __pointer_type in_stack_fffffffffffffe28;
  atomic<unsigned_int> *paVar9;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  ALCcontext *in_stack_fffffffffffffe38;
  ALCdevice *this_00;
  bool local_1b9;
  undefined4 in_stack_fffffffffffffe60;
  int iVar10;
  ALCcontext *in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffeb8;
  ALCcontext *in_stack_fffffffffffffec0;
  span<Voice_*,_18446744073709551615UL> *this_01;
  iterator local_110;
  int local_fc;
  Voice *local_f8;
  span<Voice_*,_18446744073709551615UL> local_f0;
  long local_d8;
  long local_d0;
  __int_type *local_c8;
  Voice *local_c0;
  bool local_b5;
  __int_type local_b4;
  memory_order local_b0;
  int local_ac;
  atomic<unsigned_int> *local_a8;
  __int_type local_9c;
  memory_order local_98;
  int local_94;
  atomic<unsigned_int> *local_90;
  __int_type local_84;
  memory_order local_80;
  int local_7c;
  atomic<unsigned_int> *local_78;
  long local_70;
  undefined8 local_68;
  undefined4 local_5c;
  undefined8 local_58;
  long *local_50;
  __int_type local_48;
  memory_order local_44;
  int local_40;
  __int_type local_3c;
  atomic<unsigned_int> *local_38;
  __int_type local_30;
  memory_order local_2c;
  int local_28;
  __int_type local_24;
  atomic<unsigned_int> *local_20;
  __int_type local_18;
  memory_order local_14;
  int local_10;
  __int_type local_c;
  atomic<unsigned_int> *local_8;
  
  local_d8 = in_RCX;
  local_d0 = in_RDX;
  local_c8 = in_RSI;
  local_c0 = in_RDI;
  local_f0 = ALCcontext::getVoicesSpan(in_stack_fffffffffffffe38);
  local_f8 = (Voice *)0x0;
  local_fc = 0;
  local_110 = al::span<Voice_*,_18446744073709551615UL>::begin(&local_f0);
  ppVVar4 = al::span<Voice_*,_18446744073709551615UL>::end(&local_f0);
  for (; pVVar1 = local_f8, local_110 != ppVVar4; local_110 = local_110 + 1) {
    pVVar1 = *local_110;
    SVar3 = std::atomic<Voice::State>::load(&pVVar1->mPlayState,memory_order_acquire);
    if (SVar3 == Stopped) {
      paVar9 = &pVVar1->mSourceID;
      local_7c = 0;
      local_78 = paVar9;
      local_80 = std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_7c - 1U < 2) {
        local_84 = (paVar9->super___atomic_base<unsigned_int>)._M_i;
      }
      else if (local_7c == 5) {
        local_84 = (paVar9->super___atomic_base<unsigned_int>)._M_i;
      }
      else {
        local_84 = (paVar9->super___atomic_base<unsigned_int>)._M_i;
      }
      if ((local_84 == 0) &&
         (bVar2 = std::atomic<bool>::load
                            ((atomic<bool> *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24),
         !bVar2)) break;
    }
    local_fc = local_fc + 1;
  }
  local_f8 = pVVar1;
  pVVar1 = local_f8;
  if (local_f8 == (Voice *)0x0) {
    this = std::atomic<al::FlexArray<Voice_*,_8UL>_*>::load
                     ((atomic<al::FlexArray<Voice_*,_8UL>_*> *)in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe24);
    iVar5 = al::FlexArray<Voice_*,_8UL>::size(this);
    iVar6 = al::span<Voice_*,_18446744073709551615UL>::size(&local_f0);
    if (iVar5 == iVar6) {
      ALCcontext::allocVoices(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    local_50 = (long *)(local_d8 + 0x160);
    local_58 = 1;
    local_5c = 3;
    local_68 = 1;
    LOCK();
    local_70 = *local_50;
    *local_50 = *local_50 + 1;
    UNLOCK();
    local_f0 = ALCcontext::getVoicesSpan(in_stack_fffffffffffffe38);
    local_fc = 0;
    this_01 = &local_f0;
    ppVVar4 = al::span<Voice_*,_18446744073709551615UL>::begin(this_01);
    ppVVar7 = al::span<Voice_*,_18446744073709551615UL>::end(this_01);
    for (; pVVar1 = local_f8, ppVVar4 != ppVVar7; ppVVar4 = ppVVar4 + 1) {
      pVVar1 = *ppVVar4;
      SVar3 = std::atomic<Voice::State>::load(&pVVar1->mPlayState,memory_order_acquire);
      if (SVar3 == Stopped) {
        in_stack_fffffffffffffe68 = (ALCcontext *)&pVVar1->mSourceID;
        local_94 = 0;
        local_90 = (atomic<unsigned_int> *)in_stack_fffffffffffffe68;
        local_98 = std::operator&(memory_order_relaxed,__memory_order_mask);
        if (local_94 - 1U < 2) {
          local_9c = ((__atomic_base<unsigned_int> *)
                     &in_stack_fffffffffffffe68->super_intrusive_ref<ALCcontext>)->_M_i;
        }
        else if (local_94 == 5) {
          local_9c = ((__atomic_base<unsigned_int> *)
                     &in_stack_fffffffffffffe68->super_intrusive_ref<ALCcontext>)->_M_i;
        }
        else {
          local_9c = ((__atomic_base<unsigned_int> *)
                     &in_stack_fffffffffffffe68->super_intrusive_ref<ALCcontext>)->_M_i;
        }
        if ((local_9c == 0) &&
           (bVar2 = std::atomic<bool>::load
                              ((atomic<bool> *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24),
           !bVar2)) break;
      }
      local_fc = local_fc + 1;
    }
  }
  local_f8 = pVVar1;
  std::atomic<Voice::State>::store(&local_f8->mPlayState,Pending,memory_order_relaxed);
  paVar9 = &local_f8->mPosition;
  local_c = *local_c8;
  local_10 = 0;
  local_8 = paVar9;
  local_14 = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_18 = local_c;
  if (local_10 == 3) {
    (paVar9->super___atomic_base<unsigned_int>)._M_i = local_c;
  }
  else if (local_10 == 5) {
    LOCK();
    (paVar9->super___atomic_base<unsigned_int>)._M_i = local_c;
    UNLOCK();
  }
  else {
    (paVar9->super___atomic_base<unsigned_int>)._M_i = local_c;
  }
  paVar9 = &local_f8->mPositionFrac;
  local_24 = local_c8[1];
  local_28 = 0;
  iVar10 = local_10;
  local_20 = paVar9;
  local_2c = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_30 = local_24;
  if (local_28 == 3) {
    (paVar9->super___atomic_base<unsigned_int>)._M_i = local_24;
  }
  else if (local_28 == 5) {
    LOCK();
    (paVar9->super___atomic_base<unsigned_int>)._M_i = local_24;
    UNLOCK();
  }
  else {
    (paVar9->super___atomic_base<unsigned_int>)._M_i = local_24;
  }
  std::atomic<BufferlistItem_*>::store
            ((atomic<BufferlistItem_*> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe24);
  local_1b9 = true;
  if ((*local_c8 == 0) && (local_1b9 = true, local_c8[1] == 0)) {
    local_1b9 = *(long *)(local_c8 + 2) != *(long *)(local_d0 + 0x180);
  }
  local_f8->mFlags = (uint)local_1b9 << 4;
  InitVoice(in_stack_00001628,in_stack_00001620,in_stack_00001618,in_stack_00001610,
            in_stack_00001608);
  *(int *)(local_d0 + 0x18c) = local_fc;
  std::atomic<bool>::store
            ((atomic<bool> *)in_stack_fffffffffffffe28,SUB41(in_stack_fffffffffffffe24 >> 0x18,0),
             in_stack_fffffffffffffe20);
  pVVar8 = GetVoiceChanger((ALCcontext *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  pVVar8->mOldVoice = local_c0;
  pVVar8->mVoice = local_f8;
  pVVar8->mSourceID = *(ALuint *)(local_d0 + 400);
  pVVar8->mState = 0x1025;
  SendVoiceChanges(in_stack_fffffffffffffe68,
                   (VoiceChange *)CONCAT44(iVar10,in_stack_fffffffffffffe60));
  this_00 = (ALCdevice *)&local_c0->mSourceID;
  local_ac = 2;
  local_a8 = (atomic<unsigned_int> *)this_00;
  local_b0 = std::operator&(memory_order_acquire,__memory_order_mask);
  if (local_ac - 1U < 2) {
    local_b4 = ((__atomic_base<unsigned_int> *)&this_00->super_intrusive_ref<ALCdevice>)->_M_i;
  }
  else if (local_ac == 5) {
    local_b4 = ((__atomic_base<unsigned_int> *)&this_00->super_intrusive_ref<ALCdevice>)->_M_i;
  }
  else {
    local_b4 = ((__atomic_base<unsigned_int> *)&this_00->super_intrusive_ref<ALCdevice>)->_M_i;
  }
  if (local_b4 == 0) {
    SVar3 = std::atomic<Voice::State>::load(&local_f8->mPlayState,memory_order_acquire);
    if (SVar3 == Pending) {
      ALCdevice::waitForMix(this_00);
      SVar3 = std::atomic<Voice::State>::load(&local_f8->mPlayState,memory_order_acquire);
      if (SVar3 == Pending) {
        __m = memory_order_relaxed;
        std::atomic<BufferlistItem_*>::store
                  ((atomic<BufferlistItem_*> *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe28,memory_order_relaxed);
        std::atomic<BufferlistItem_*>::store
                  ((atomic<BufferlistItem_*> *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe28,__m);
        paVar9 = &local_f8->mSourceID;
        local_3c = 0;
        local_40 = 0;
        local_38 = paVar9;
        local_44 = std::operator&(memory_order_relaxed,__memory_order_mask);
        local_48 = local_3c;
        if (local_40 == 3) {
          (paVar9->super___atomic_base<unsigned_int>)._M_i = local_3c;
        }
        else if (local_40 == 5) {
          LOCK();
          (paVar9->super___atomic_base<unsigned_int>)._M_i = local_3c;
          UNLOCK();
        }
        else {
          (paVar9->super___atomic_base<unsigned_int>)._M_i = local_3c;
        }
        std::atomic<Voice::State>::store(&local_f8->mPlayState,Stopped,memory_order_relaxed);
        local_b5 = false;
      }
      else {
        local_b5 = true;
      }
    }
    else {
      local_b5 = true;
    }
  }
  else {
    local_b5 = true;
  }
  return local_b5;
}

Assistant:

bool SetVoiceOffset(Voice *oldvoice, const VoicePos &vpos, ALsource *source, ALCcontext *context,
    ALCdevice *device)
{
    /* First, get a free voice to start at the new offset. */
    auto voicelist = context->getVoicesSpan();
    Voice *newvoice{};
    ALuint vidx{0};
    for(Voice *voice : voicelist)
    {
        if(voice->mPlayState.load(std::memory_order_acquire) == Voice::Stopped
            && voice->mSourceID.load(std::memory_order_relaxed) == 0u
            && voice->mPendingChange.load(std::memory_order_relaxed) == false)
        {
            newvoice = voice;
            break;
        }
        ++vidx;
    }
    if UNLIKELY(!newvoice)
    {
        auto &allvoices = *context->mVoices.load(std::memory_order_relaxed);
        if(allvoices.size() == voicelist.size())
            context->allocVoices(1);
        context->mActiveVoiceCount.fetch_add(1, std::memory_order_release);
        voicelist = context->getVoicesSpan();

        vidx = 0;
        for(Voice *voice : voicelist)
        {
            if(voice->mPlayState.load(std::memory_order_acquire) == Voice::Stopped
                && voice->mSourceID.load(std::memory_order_relaxed) == 0u
                && voice->mPendingChange.load(std::memory_order_relaxed) == false)
            {
                newvoice = voice;
                break;
            }
            ++vidx;
        }
    }